

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_object_dotremove_internal(JSON_Object *object,char *name,parson_bool_t free_value)

{
  JSON_Value_Type JVar1;
  char *pcVar2;
  JSON_Value *value;
  JSON_Object *object_00;
  char *dot_pos;
  JSON_Object *temp_object;
  JSON_Value *temp_value;
  parson_bool_t free_value_local;
  char *name_local;
  JSON_Object *object_local;
  
  pcVar2 = strchr(name,0x2e);
  if (pcVar2 == (char *)0x0) {
    object_local._4_4_ = json_object_remove_internal(object,name,free_value);
  }
  else {
    value = json_object_getn_value(object,name,(long)pcVar2 - (long)name);
    JVar1 = json_value_get_type(value);
    if (JVar1 == 4) {
      object_00 = json_value_get_object(value);
      object_local._4_4_ = json_object_dotremove_internal(object_00,pcVar2 + 1,free_value);
    }
    else {
      object_local._4_4_ = -1;
    }
  }
  return object_local._4_4_;
}

Assistant:

static JSON_Status json_object_dotremove_internal(JSON_Object *object, const char *name, parson_bool_t free_value) {
    JSON_Value *temp_value = NULL;
    JSON_Object *temp_object = NULL;
    const char *dot_pos = strchr(name, '.');
    if (!dot_pos) {
        return json_object_remove_internal(object, name, free_value);
    }
    temp_value = json_object_getn_value(object, name, dot_pos - name);
    if (json_value_get_type(temp_value) != JSONObject) {
        return JSONFailure;
    }
    temp_object = json_value_get_object(temp_value);
    return json_object_dotremove_internal(temp_object, dot_pos + 1, free_value);
}